

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void crnlib::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  vq_node *local_38;
  vq_node *pDst;
  vq_node *pSrc_end;
  vq_node *pSrc;
  uint num_local;
  void *pSrc_void_local;
  void *pDst_void_local;
  
  local_38 = (vq_node *)pDst_void;
  for (pSrc_end = (vq_node *)pSrc_void; pSrc_end != (vq_node *)((long)pSrc_void + (ulong)num * 0x40)
      ; pSrc_end = pSrc_end + 1) {
    tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node::vq_node(local_38,pSrc_end);
    local_38 = local_38 + 1;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }